

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

void __thiscall anon_func::Mapper::~Mapper(Mapper *this)

{
  array<wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::Task,_10UL> *paVar1;
  TaskFunc p_Var2;
  Info *pIVar3;
  Task *pTVar4;
  
  (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
  super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.replacep = (Expression **)&PTR__Mapper_00d8c230
  ;
  p_Var2 = this[1].super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed._M_elems[1].func;
  if (p_Var2 != (TaskFunc)0x0) {
    paVar1 = &this[1].super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>.
              super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed;
    (*p_Var2)((Mapper *)paVar1,(Expression **)paVar1);
  }
  pIVar3 = this->info;
  if (pIVar3 != (Info *)0x0) {
    operator_delete(pIVar3,*(long *)((long)&(this->work).super__Function_base._M_functor + 8) -
                           (long)pIVar3);
  }
  (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
  super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.replacep = (Expression **)&PTR__Pass_00d87048;
  p_Var2 = (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed._M_elems[0].func;
  pTVar4 = (this->super_PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>).
           super_Walker<Mapper,_wasm::Visitor<Mapper,_void>_>.stack.fixed._M_elems + 1;
  if ((Task *)p_Var2 != pTVar4) {
    operator_delete(p_Var2,(ulong)(pTVar4->func + 1));
    return;
  }
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }